

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::SpecifyBlockSyntax::setChild
          (SpecifyBlockSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 in_RDX;
  
  (*(code *)(&DAT_0048ec40 + *(int *)(&DAT_0048ec40 + index * 4)))
            (&child,index,in_RDX,&DAT_0048ec40 + *(int *)(&DAT_0048ec40 + index * 4));
  return;
}

Assistant:

void SpecifyBlockSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: specify = child.token(); return;
        case 2: items = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 3: endspecify = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}